

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_crypt.c
# Opt level: O3

int ulp_ring_decrypt(ulp_ring_ciphertext *ciphertext,ulp_ring_private_key *priv_key,uint8_t **msg_p)

{
  ulong n;
  size_t l;
  uint64_t q;
  uint64_t *puVar1;
  int iVar2;
  uint64_t *result;
  uint8_t *out;
  size_t sVar3;
  
  iVar2 = -1;
  if (priv_key != (ulp_ring_private_key *)0x0 && ciphertext != (ulp_ring_ciphertext *)0x0) {
    n = ciphertext->n;
    iVar2 = -2;
    if (n == priv_key->n) {
      result = (uint64_t *)malloc(n * 8);
      out = (uint8_t *)malloc(((n >> 3) + 1) - (ulong)((n & 7) == 0));
      if (((result == (uint64_t *)0x0) || (out == (uint8_t *)0x0)) ||
         (iVar2 = poly_mulmod(priv_key->s,ciphertext->c1,n,priv_key->q,result), iVar2 != 0)) {
        free(result);
        free(out);
        iVar2 = -1;
      }
      else {
        l = priv_key->n;
        q = priv_key->q;
        if (l != 0) {
          puVar1 = ciphertext->c2;
          sVar3 = 0;
          do {
            result[sVar3] = (puVar1[sVar3] + result[sVar3]) % q;
            sVar3 = sVar3 + 1;
          } while (l != sVar3);
        }
        decode(result,out,l,q);
        free(result);
        *msg_p = out;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int ulp_ring_decrypt(ulp_ring_ciphertext* ciphertext, ulp_ring_private_key* priv_key, uint8_t** msg_p) {

    if(ciphertext == NULL || priv_key == NULL)
        return -1;

    if(ciphertext->n != priv_key->n)
        return -2;

    // compute number of bytes needed for storing the decrypted plaintext
    size_t num_bytes = priv_key->n / 8;
    if(num_bytes * 8 != priv_key->n)
        num_bytes++;

    // allocate memory
    uint64_t* tmp = malloc(priv_key->n * sizeof(priv_key->q));
    uint8_t* msg = malloc(num_bytes);
    if(tmp == NULL || msg == NULL)
        goto fail;

    // s * c1 + c2
    if(poly_mulmod(priv_key->s, ciphertext->c1, priv_key->n, priv_key->q, tmp) != 0)
        goto fail;
    for(size_t i = 0; i < priv_key->n; i++) {
        tmp[i] = (tmp[i] + ciphertext->c2[i]) % priv_key->q;
    }

    // decode decrypted message
    decode(tmp, msg, priv_key->n, priv_key->q);

    // exit properly
    free(tmp);
    *msg_p = msg;
    return 0;


    fail:
        free(tmp);
        free(msg);
        return -1;

}